

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Point3<float> __thiscall pbrt::Transform::ApplyInverse<float>(Transform *this,Point3<float> *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Tuple3<pbrt::Point3,_float> TVar3;
  uint uVar4;
  float *pfVar5;
  uint *in_RSI;
  undefined8 in_RDI;
  float fVar6;
  float line;
  float fVar7;
  undefined1 auVar9 [56];
  undefined1 auVar8 [64];
  Point3<float> PVar10;
  int vb;
  float va;
  float wp;
  float zp;
  float yp;
  float xp;
  float z;
  float y;
  float x;
  undefined8 in_stack_fffffffffffffde8;
  SquareMatrix<4> *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  float d;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffffe00;
  uint uVar11;
  float fVar12;
  uint uVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  LogLevel level;
  float fVar18;
  float *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int *in_stack_fffffffffffffe88;
  span<const_float> local_150;
  span<const_float> local_140;
  span<const_float> local_130;
  span<const_float> local_120;
  float local_10c;
  span<const_float> local_108;
  span<const_float> local_f8;
  span<const_float> local_e8;
  span<const_float> local_d8;
  float local_c4;
  span<const_float> local_c0;
  span<const_float> local_b0;
  span<const_float> local_a0;
  span<const_float> local_90;
  float local_7c;
  span<const_float> local_78;
  span<const_float> local_68;
  span<const_float> local_58;
  span<const_float> local_48;
  float local_38;
  uint local_34;
  float local_30;
  uint local_2c;
  undefined8 local_14;
  float local_c;
  
  d = (float)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  level = (LogLevel)((ulong)in_RDI >> 0x20);
  local_2c = *in_RSI;
  local_30 = (float)in_RSI[1];
  local_34 = in_RSI[2];
  local_48 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_48,0);
  uVar4 = local_2c;
  fVar12 = *pfVar5;
  local_58 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_58,1);
  auVar1 = vfmadd213ss_fma(ZEXT416(uVar4),ZEXT416((uint)fVar12),ZEXT416((uint)(*pfVar5 * local_30)))
  ;
  local_68 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_68,2);
  uVar4 = local_34;
  fVar12 = *pfVar5;
  local_78 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_78,3);
  auVar2 = vfmadd213ss_fma(ZEXT416(uVar4),ZEXT416((uint)fVar12),ZEXT416((uint)*pfVar5));
  local_38 = auVar1._0_4_ + auVar2._0_4_;
  local_90 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_90,0);
  uVar4 = local_2c;
  fVar12 = *pfVar5;
  local_a0 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_a0,1);
  auVar1 = vfmadd213ss_fma(ZEXT416(uVar4),ZEXT416((uint)fVar12),ZEXT416((uint)(*pfVar5 * local_30)))
  ;
  fVar6 = auVar1._0_4_;
  local_b0 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_b0,2);
  fVar12 = *pfVar5;
  uVar11 = local_34;
  local_c0 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_c0,3);
  auVar1 = vfmadd213ss_fma(ZEXT416(uVar11),ZEXT416((uint)fVar12),ZEXT416((uint)*pfVar5));
  local_7c = fVar6 + auVar1._0_4_;
  local_d8 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_d8,0);
  fVar14 = *pfVar5;
  uVar13 = local_2c;
  local_e8 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_e8,1);
  auVar1 = vfmadd213ss_fma(ZEXT416(uVar13),ZEXT416((uint)fVar14),ZEXT416((uint)(*pfVar5 * local_30))
                          );
  line = auVar1._0_4_;
  local_f8 = SquareMatrix<4>::operator[]
                       (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_f8,2);
  fVar17 = *pfVar5;
  uVar15 = local_34;
  local_108 = SquareMatrix<4>::operator[]
                        (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_108,3);
  auVar1 = vfmadd213ss_fma(ZEXT416(uVar15),ZEXT416((uint)fVar17),ZEXT416((uint)*pfVar5));
  local_c4 = line + auVar1._0_4_;
  local_120 = SquareMatrix<4>::operator[]
                        (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_120,0);
  fVar17 = *pfVar5;
  uVar16 = local_2c;
  local_130 = SquareMatrix<4>::operator[]
                        (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_130,1);
  auVar1 = vfmadd213ss_fma(ZEXT416(uVar16),ZEXT416((uint)fVar17),ZEXT416((uint)(*pfVar5 * local_30))
                          );
  fVar7 = auVar1._0_4_;
  local_140 = SquareMatrix<4>::operator[]
                        (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_140,2);
  uVar4 = local_34;
  fVar18 = *pfVar5;
  local_150 = SquareMatrix<4>::operator[]
                        (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  pfVar5 = pstd::span<const_float>::operator[](&local_150,3);
  auVar1 = vfmadd213ss_fma(ZEXT416(uVar4),ZEXT416((uint)fVar18),ZEXT416((uint)*pfVar5));
  local_10c = fVar7 + auVar1._0_4_;
  if ((local_10c == 0.0) && (!NAN(local_10c))) {
    LogFatal<char_const(&)[3],char_const(&)[2],char_const(&)[3],float&,char_const(&)[2],int&>
              (level,(char *)CONCAT44(fVar17,uVar16),(int)line,(char *)CONCAT44(uVar15,fVar14),
               (char (*) [3])CONCAT44(uVar13,fVar6),(char (*) [2])CONCAT44(fVar12,uVar11),
               (char (*) [3])CONCAT44(fVar7,fVar18),in_stack_fffffffffffffe78,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe88);
  }
  fVar12 = (float)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  if ((local_10c != 1.0) || (NAN(local_10c))) {
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffdf0,fVar12,(float)in_stack_fffffffffffffde8,
               0.0);
    auVar9 = (undefined1  [56])0x0;
    PVar10 = Tuple3<pbrt::Point3,float>::operator/(in_stack_fffffffffffffe00,d);
    local_c = PVar10.super_Tuple3<pbrt::Point3,_float>.z;
    auVar8._0_8_ = PVar10.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar9;
    local_14 = vmovlpd_avx(auVar8._0_16_);
  }
  else {
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffdf0,fVar12,(float)in_stack_fffffffffffffde8,
               0.0);
  }
  TVar3.z = local_c;
  TVar3.x = (float)(undefined4)local_14;
  TVar3.y = (float)local_14._4_4_;
  return (Point3<float>)TVar3;
}

Assistant:

inline Point3<T> Transform::ApplyInverse(const Point3<T> &p) const {
    T x = p.x, y = p.y, z = p.z;
    T xp = (mInv[0][0] * x + mInv[0][1] * y) + (mInv[0][2] * z + mInv[0][3]);
    T yp = (mInv[1][0] * x + mInv[1][1] * y) + (mInv[1][2] * z + mInv[1][3]);
    T zp = (mInv[2][0] * x + mInv[2][1] * y) + (mInv[2][2] * z + mInv[2][3]);
    T wp = (mInv[3][0] * x + mInv[3][1] * y) + (mInv[3][2] * z + mInv[3][3]);
    CHECK_NE(wp, 0);
    if (wp == 1)
        return Point3<T>(xp, yp, zp);
    else
        return Point3<T>(xp, yp, zp) / wp;
}